

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<double,_std::allocator<double>_> *vec)

{
  double *pdVar1;
  ostream *poVar2;
  double *item;
  double *pdVar3;
  
  pdVar1 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}